

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O0

Vec3fx * embree::copyArrayToUSM<embree::Vec3fx>(avector<embree::Vec3fx> *in)

{
  Vec3fx *__dest;
  size_t in_RDI;
  Vec3fx *out;
  size_t in_stack_ffffffffffffffd8;
  
  __dest = (Vec3fx *)alignedUSMMalloc(in_RDI,in_stack_ffffffffffffffd8,DEFAULT);
  memcpy(__dest,*(void **)(in_RDI + 0x18),*(long *)(in_RDI + 8) << 4);
  return __dest;
}

Assistant:

Ty* copyArrayToUSM(const avector<Ty>& in) {
    Ty* out = (Ty*)alignedUSMMalloc(in.size()*sizeof(Ty));
    memcpy((void*)out,in.data(),in.size()*sizeof(Ty));
    return out;
  }